

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O1

Problem * preprocessProblem(Problem *prb)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  Preprocess prepro;
  Preprocess local_13a0;
  Property *in_stack_ffffffffffffec78;
  Options *in_stack_ffffffffffffec80;
  
  uVar1 = (Lib::env->_randomSeed).super_OptionValue<unsigned_int>.actualValue;
  uVar2 = (ulong)uVar1;
  if (uVar2 == 0) {
    std::random_device::random_device((random_device *)&local_13a0);
    Lib::Random::_seed = std::random_device::_M_getval();
    uVar2 = (ulong)Lib::Random::_seed;
    lVar3 = 1;
    Lib::Random::_eng._M_x[0] = uVar2;
    do {
      uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
      Lib::Random::_eng._M_x[lVar3] = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    Lib::Random::_eng._M_p = 0x270;
    std::random_device::_M_fini();
  }
  else {
    lVar3 = 1;
    Lib::Random::_seed = uVar1;
    Lib::Random::_eng._M_x[0] = uVar2;
    do {
      uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
      Lib::Random::_eng._M_x[lVar3] = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    Lib::Random::_eng._M_p = 0x270;
  }
  if ((Lib::env->_mode).super_OptionValue<Shell::Options::Mode>.actualValue != SPIDER) {
    Kernel::Problem::getProperty(prb);
    Shell::Options::checkProblemOptionConstraints
              (in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,false,false);
  }
  local_13a0._options = Lib::env;
  local_13a0._clausify = true;
  local_13a0._stillSimplify = false;
  Shell::Preprocess::preprocess(&local_13a0,prb);
  return prb;
}

Assistant:

[[nodiscard]]
Problem* preprocessProblem(Problem* prb)
{
  // Here officially starts preprocessing of vampireMode
  // and that's the moment we want to set the random seed (no randomness in parsing, for the peace of mind)
  // the main reason being that we want to stay in sync with what portfolio mode will do
  // cf ProvingHelper::runVampire
  if (env.options->randomSeed() != 0) {
    Lib::Random::setSeed(env.options->randomSeed());
  } else {
    Lib::Random::resetSeed();
  }

  TIME_TRACE(TimeTrace::PREPROCESSING);

  // this will provide warning if options don't make sense for problem
  if (env.options->mode()!=Options::Mode::SPIDER) {
    env.options->checkProblemOptionConstraints(prb->getProperty(), /*before_preprocessing = */ true);
  }

  Shell::Preprocess prepro(*env.options);
  //phases for preprocessing are being set inside the preprocess method
  prepro.preprocess(*prb);

  return prb;
}